

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateRotationNodeAnim
          (FBXConverter *this,string *name,Model *target,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  ulong __n;
  RotOrder order;
  aiNodeAnim *na;
  aiVectorKey *paVar1;
  LayerMap *pLVar2;
  
  pLVar2 = (LayerMap *)curves;
  na = (aiNodeAnim *)operator_new(0x438);
  (na->mNodeName).length = 0;
  (na->mNodeName).data[0] = '\0';
  memset((na->mNodeName).data + 1,0x1b,0x3ff);
  na->mRotationKeys = (aiQuatKey *)0x0;
  na->mNumScalingKeys = 0;
  *(undefined8 *)&na->mNumPositionKeys = 0;
  *(undefined8 *)((long)&na->mPositionKeys + 4) = 0;
  na->mScalingKeys = (aiVectorKey *)0x0;
  na->mPreState = aiAnimBehaviour_DEFAULT;
  na->mPostState = aiAnimBehaviour_DEFAULT;
  __n = name->_M_string_length;
  if (__n < 0x400) {
    (na->mNodeName).length = (ai_uint32)__n;
    memcpy((na->mNodeName).data,(name->_M_dataplus)._M_p,__n);
    (na->mNodeName).data[__n] = '\0';
  }
  order = Model::RotationOrder(target);
  ConvertRotationKeys(this,na,curves,pLVar2,start,stop,max_time,min_time,order);
  paVar1 = (aiVectorKey *)operator_new__(0x18);
  paVar1->mTime = 0.0;
  (paVar1->mValue).x = 0.0;
  (paVar1->mValue).y = 0.0;
  (paVar1->mValue).z = 0.0;
  na->mScalingKeys = paVar1;
  na->mNumScalingKeys = 1;
  paVar1->mTime = 0.0;
  paVar1 = na->mScalingKeys;
  (paVar1->mValue).x = 1.0;
  (paVar1->mValue).y = 1.0;
  (paVar1->mValue).z = 1.0;
  paVar1 = (aiVectorKey *)operator_new__(0x18);
  (paVar1->mValue).z = 0.0;
  paVar1->mTime = 0.0;
  (paVar1->mValue).x = 0.0;
  (paVar1->mValue).y = 0.0;
  na->mPositionKeys = paVar1;
  na->mNumPositionKeys = 1;
  paVar1->mTime = 0.0;
  paVar1 = na->mPositionKeys;
  (paVar1->mValue).x = 0.0;
  (paVar1->mValue).y = 0.0;
  (paVar1->mValue).z = 0.0;
  return na;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateRotationNodeAnim(const std::string& name,
            const Model& target,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertRotationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time, target.RotationOrder());

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy position key
            na->mPositionKeys = new aiVectorKey[1];
            na->mNumPositionKeys = 1;

            na->mPositionKeys[0].mTime = 0.;
            na->mPositionKeys[0].mValue = aiVector3D();

            return na.release();
        }